

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_ti_hecc(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint32_t can_btc;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%08x",(ulong)((*(int *)(in_RDI + 0x1c) - 1U & 0xff) << 0x10 |
                           (*(int *)(in_RDI + 0x18) - 1U & 3) << 8 |
                           ((*(int *)(in_RDI + 0x10) + *(int *)(in_RDI + 0xc)) - 1U & 0xf) << 3 |
                           *(int *)(in_RDI + 0x14) - 1U & 7));
  }
  else {
    printf("%10s","CANBTC");
  }
  return;
}

Assistant:

static void printf_btr_ti_hecc(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "CANBTC");
	} else {
		uint32_t can_btc;

		can_btc = (bt->phase_seg2 - 1) & 0x7;
		can_btc |= ((bt->phase_seg1 + bt->prop_seg - 1)
			    & 0xF) << 3;
		can_btc |= ((bt->sjw - 1) & 0x3) << 8;
		can_btc |= ((bt->brp - 1) & 0xFF) << 16;

		printf("0x%08x", can_btc);
	}
}